

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::resize(SparseArray<re2::NFA::Thread_*> *this,int new_max_size)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  int *__dest;
  reference pvVar4;
  int local_24;
  int i;
  int *a;
  int new_max_size_local;
  SparseArray<re2::NFA::Thread_*> *this_local;
  
  DebugCheckInvariants(this);
  if (this->max_size_ < new_max_size) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)new_max_size;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    __dest = (int *)operator_new__(uVar3);
    if (this->sparse_to_dense_ != (int *)0x0) {
      memmove(__dest,this->sparse_to_dense_,(long)this->max_size_ << 2);
      if (this->sparse_to_dense_ != (int *)0x0) {
        operator_delete__(this->sparse_to_dense_);
      }
    }
    this->sparse_to_dense_ = __dest;
    std::
    vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
    ::resize(&this->dense_,(long)new_max_size);
    bVar2 = InitMemory();
    if (bVar2) {
      for (local_24 = this->max_size_; local_24 < new_max_size; local_24 = local_24 + 1) {
        this->sparse_to_dense_[local_24] = -0x54545455;
        pvVar4 = std::
                 vector<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                 ::operator[](&this->dense_,(long)local_24);
        pvVar4->index_ = -0x54545455;
      }
    }
  }
  this->max_size_ = new_max_size;
  if (this->max_size_ < this->size_) {
    this->size_ = this->max_size_;
  }
  DebugCheckInvariants(this);
  return;
}

Assistant:

void SparseArray<Value>::resize(int new_max_size) {
  DebugCheckInvariants();
  if (new_max_size > max_size_) {
    int* a = new int[new_max_size];
    if (sparse_to_dense_) {
      memmove(a, sparse_to_dense_, max_size_*sizeof a[0]);
      delete[] sparse_to_dense_;
    }
    sparse_to_dense_ = a;

    dense_.resize(new_max_size);

    // These don't need to be initialized for correctness,
    // but Valgrind will warn about use of uninitialized memory,
    // so initialize the new memory when compiling debug binaries.
    // Initialize it to garbage to detect bugs in the future.
    if (InitMemory()) {
      for (int i = max_size_; i < new_max_size; i++) {
        sparse_to_dense_[i] = 0xababababU;
        dense_[i].index_ = 0xababababU;
      }
    }
  }
  max_size_ = new_max_size;
  if (size_ > max_size_)
    size_ = max_size_;
  DebugCheckInvariants();
}